

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjalalicalendar.cpp
# Opt level: O1

YearMonthDay __thiscall QJalaliCalendar::julianDayToDate(QJalaliCalendar *this,qint64 jd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  YearMonthDay YVar10;
  
  if (jd < 0x205ee6) {
    iVar2 = (int)((jd + -0x205ee5) / 0xfb75f) + -1;
  }
  else {
    iVar2 = (int)((jd - 0x205ee6U) / 0xfb75f);
  }
  dVar8 = floor((double)(jd + (long)iVar2 * -0xfb75f + -0x205ee6) / 365.2421985815603);
  iVar3 = iVar2 * 0xb04 + (int)dVar8 + 0x1db;
  dVar9 = floor((double)(int)dVar8 * 365.2421985815603);
  iVar5 = ((int)jd - (iVar2 * 0xfb75f + (int)dVar9)) + -0x205ee5;
  iVar3 = (*(this->super_QCalendarBackend)._vptr_QCalendarBackend[4])
                    (this,(ulong)(iVar3 - (uint)(iVar3 < 1)));
  bVar1 = iVar3 < iVar5;
  uVar7 = 1;
  if (iVar3 < iVar5) {
    iVar5 = 1;
  }
  iVar2 = (uint)bVar1 + iVar2 * 0xb04 + (int)dVar8 + 0x1db;
  uVar4 = iVar2 - (uint)(iVar2 < 1);
  do {
    iVar3 = (*(this->super_QCalendarBackend)._vptr_QCalendarBackend[3])(this,uVar7,(ulong)uVar4);
    iVar2 = iVar3;
    if (iVar5 <= iVar3) {
      iVar2 = 0;
    }
    YVar10.day = iVar5 - iVar2;
    if (iVar5 <= iVar3) goto LAB_00400aa9;
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
    iVar5 = YVar10.day;
  } while (uVar6 != 0xc);
  uVar7 = 0xc;
LAB_00400aa9:
  YVar10._0_8_ = (ulong)uVar4 | uVar7 << 0x20;
  return YVar10;
}

Assistant:

QCalendar::YearMonthDay QJalaliCalendar::julianDayToDate(qint64 jd) const
{
    const int c = cycle(jd);
    int yearInCycle = qFloor((jd - cycleStart(c)) / yearLength);
    int year = yearInCycle + 475 + c * cycleYears;
    int day = jd - firstDayOfYear(yearInCycle, c) + 1;
    if (day > daysInYear(year <= 0 ? year - 1 : year)) {
        ++year;
        day = 1;
    }
    if (year <= 0)
        year--;
    int month;
    for (month = 1; month < 12; ++month) {
        const int last = daysInMonth(month, year);
        if (day <= last)
            break;
        day -= last;
    }
    return QCalendar::YearMonthDay(year, month, day);
}